

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void soundfiler_read(t_soundfiler *x,t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  t_word *ptVar6;
  int *piVar7;
  ulong uVar8;
  ssize_t sVar9;
  size_t nframes_00;
  bool bVar10;
  t_float tVar11;
  float local_964;
  ulong local_960;
  float local_948;
  t_word *local_940;
  t_word *foo;
  int vecsize_3;
  int vecsize_2;
  size_t thisread;
  undefined1 auStack_920 [4];
  int vecsize_1;
  t_asciiargs a;
  int vecsize;
  ssize_t tmp;
  char *flag;
  char sampbuf [1024];
  t_word *vecs [64];
  _garray *garrays [64];
  char *filename;
  ulong uStack_b8;
  char endianness;
  ssize_t framesinfile;
  ssize_t nframes;
  size_t j;
  size_t bufframes;
  size_t framesread;
  size_t maxsize;
  size_t finalsize;
  size_t skipframes;
  int i;
  int raw;
  int ascii;
  int resize;
  int fd;
  t_soundfile sf;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_soundfiler *x_local;
  
  sf.sf_bytelimit = (ssize_t)argv;
  memset(&resize,0,0x38);
  ascii = -1;
  raw = 0;
  i = 0;
  bVar2 = false;
  finalsize = 0;
  maxsize = 0;
  framesread = 0xffffffffffffffff;
  bufframes = 0;
  soundfile_clear((t_soundfile *)&resize);
  sf.sf_bytespersample = -1;
  sf._28_4_ = 0xffffffff;
  argv_local._4_4_ = argc;
  while( true ) {
    bVar10 = false;
    if ((0 < argv_local._4_4_) && (bVar10 = false, *(int *)sf.sf_bytelimit == 2)) {
      bVar10 = *(char *)**(undefined8 **)(sf.sf_bytelimit + 8) == '-';
    }
    if (!bVar10) break;
    pcVar5 = (char *)(**(long **)(sf.sf_bytelimit + 8) + 1);
    iVar3 = strcmp(pcVar5,"skip");
    if (iVar3 == 0) {
      if (((argv_local._4_4_ < 2) || (*(int *)(sf.sf_bytelimit + 0x10) != 1)) ||
         (*(float *)(sf.sf_bytelimit + 0x18) <= 0.0 && *(float *)(sf.sf_bytelimit + 0x18) != 0.0))
      goto LAB_0013bf18;
      uVar8 = (ulong)*(float *)(sf.sf_bytelimit + 0x18);
      finalsize = uVar8 | (long)(*(float *)(sf.sf_bytelimit + 0x18) - 9.223372e+18) &
                          (long)uVar8 >> 0x3f;
      argv_local._4_4_ = argv_local._4_4_ + -2;
      sf.sf_bytelimit = sf.sf_bytelimit + 0x20;
    }
    else {
      iVar3 = strcmp(pcVar5,"ascii");
      if (iVar3 == 0) {
        if (-1 < (long)sf._24_8_) {
          post("\'-ascii\' overridden by \'-raw\'");
        }
        i = 1;
        argv_local._4_4_ = argv_local._4_4_ + -1;
        sf.sf_bytelimit = sf.sf_bytelimit + 0x10;
      }
      else {
        iVar3 = strcmp(pcVar5,"raw");
        if (iVar3 == 0) {
          if (i == 0) {
            if (sf._0_8_ != 0) {
              post("\'-%s\' overridden by \'-raw\'",*(undefined8 *)sf._0_8_);
            }
          }
          else {
            post("\'-ascii\' overridden by \'-raw\'");
          }
          if (((((((argv_local._4_4_ < 5) || (*(int *)(sf.sf_bytelimit + 0x10) != 1)) ||
                 (sf._24_8_ = (BADTYPE)*(float *)(sf.sf_bytelimit + 0x18), (long)sf._24_8_ < 0)) ||
                ((*(int *)(sf.sf_bytelimit + 0x20) != 1 ||
                 (sf.sf_type._4_4_ = (int)*(float *)(sf.sf_bytelimit + 0x28), sf.sf_type._4_4_ < 1))
                )) || ((0x40 < sf.sf_type._4_4_ ||
                       ((*(int *)(sf.sf_bytelimit + 0x30) != 1 ||
                        (sf.sf_samplerate = (int)*(float *)(sf.sf_bytelimit + 0x38),
                        sf.sf_samplerate < 2)))))) || (4 < sf.sf_samplerate)) ||
             ((*(int *)(sf.sf_bytelimit + 0x40) != 2 ||
              (((cVar1 = *(char *)**(undefined8 **)(sf.sf_bytelimit + 0x48), cVar1 != 'b' &&
                (cVar1 != 'l')) && (cVar1 != 'n')))))) goto LAB_0013bf18;
          if (cVar1 == 'b') {
            sf.sf_headersize._0_4_ = 1;
          }
          else if (cVar1 == 'l') {
            sf.sf_headersize._0_4_ = 0;
          }
          else {
            sf.sf_headersize._0_4_ = sys_isbigendian();
          }
          tVar11 = sys_getsr();
          sf.sf_type._0_4_ = (int)tVar11;
          sf.sf_headersize._4_4_ = sf.sf_type._4_4_ * sf.sf_samplerate;
          bVar2 = true;
          argv_local._4_4_ = argv_local._4_4_ + -5;
          sf.sf_bytelimit = sf.sf_bytelimit + 0x50;
        }
        else {
          iVar3 = strcmp(pcVar5,"resize");
          if (iVar3 == 0) {
            raw = 1;
            argv_local._4_4_ = argv_local._4_4_ + -1;
            sf.sf_bytelimit = sf.sf_bytelimit + 0x10;
          }
          else {
            iVar3 = strcmp(pcVar5,"maxsize");
            if (iVar3 == 0) {
              if ((argv_local._4_4_ < 2) || (*(int *)(sf.sf_bytelimit + 0x10) != 1))
              goto LAB_0013bf18;
              if (*(float *)(sf.sf_bytelimit + 0x18) <= 1.8446744e+19) {
                local_948 = *(float *)(sf.sf_bytelimit + 0x18);
              }
              else {
                local_948 = 1.8446744e+19;
              }
              framesread = (size_t)local_948;
              if ((long)framesread < 0) goto LAB_0013bf18;
              raw = 1;
              argv_local._4_4_ = argv_local._4_4_ + -2;
              sf.sf_bytelimit = sf.sf_bytelimit + 0x20;
            }
            else {
              sf._0_8_ = soundfile_findtype(pcVar5);
              if ((t_soundfile_type *)sf._0_8_ == (t_soundfile_type *)0x0) goto LAB_0013bf18;
              i = 0;
              if (-1 < (long)sf._24_8_) {
                post("\'-%s\' overridden by \'-raw\'",((t_soundfile_type *)sf._0_8_)->t_name);
              }
              argv_local._4_4_ = argv_local._4_4_ + -1;
              sf.sf_bytelimit = sf.sf_bytelimit + 0x10;
            }
          }
        }
      }
    }
  }
  if (-1 < (long)sf._24_8_) {
    i = 0;
    sf.sf_fd = 0;
    sf._4_4_ = 0;
  }
  if (((0 < argv_local._4_4_) && (argv_local._4_4_ < 0x42)) && (*(int *)sf.sf_bytelimit == 2)) {
    pcVar5 = (char *)**(undefined8 **)(sf.sf_bytelimit + 8);
    iVar3 = argv_local._4_4_ + -1;
    sf.sf_bytelimit = sf.sf_bytelimit + 0x10;
    if (((i == 0) && (sf._0_8_ == 0)) && ((long)sf._24_8_ < 0)) {
      i = ascii_hasextension(pcVar5,1000);
    }
    skipframes._4_4_ = 0;
    goto LAB_0013b8ca;
  }
LAB_0013bf18:
  pd_error(x,"usage: read [flags] filename [tablename]...");
  post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...",sf_typeargs);
  post("-raw <headerbytes> <channels> <bytespersample> <endian (b, l, or n)>");
  goto LAB_0013bf4d;
LAB_0013b8ca:
  if (iVar3 <= skipframes._4_4_) goto LAB_0013b9f4;
  if (*(int *)(sf.sf_bytelimit + (long)skipframes._4_4_ * 0x10) != 2) goto LAB_0013bf18;
  ptVar6 = (t_word *)
           pd_findbyclass(*(t_symbol **)(sf.sf_bytelimit + (long)skipframes._4_4_ * 0x10 + 8),
                          garray_class);
  vecs[(long)skipframes._4_4_ + 0x3f] = ptVar6;
  if (ptVar6 == (t_word *)0x0) {
    pd_error(x,"soundfiler read: %s: no such table",
             **(undefined8 **)(sf.sf_bytelimit + (long)skipframes._4_4_ * 0x10 + 8));
    goto LAB_0013bf4d;
  }
  iVar4 = garray_getfloatwords
                    ((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],(int *)&a.field_0x3c,
                     vecs + (long)skipframes._4_4_ + -1);
  if (iVar4 == 0) {
    pd_error(x,"soundfiler read: %s: bad template for tabwrite",
             **(undefined8 **)(sf.sf_bytelimit + (long)skipframes._4_4_ * 0x10 + 8));
  }
  if (((maxsize != 0) && (maxsize != (long)(int)a._60_4_)) && (raw == 0)) {
    post("arrays have different lengths, resizing...");
    raw = 1;
  }
  maxsize = (size_t)(int)a._60_4_;
  skipframes._4_4_ = skipframes._4_4_ + 1;
  goto LAB_0013b8ca;
LAB_0013b9f4:
  if (i == 0) {
    ascii = open_soundfile_via_canvas(x->x_canvas,pcVar5,(t_soundfile *)&resize,finalsize);
    if (ascii < 0) {
      piVar7 = __errno_location();
      object_sferror(x,"soundfiler read",pcVar5,*piVar7,(t_soundfile *)&resize);
    }
    else {
      uStack_b8 = (long)sf._40_8_ / (long)sf.sf_headersize._4_4_;
      if (raw != 0) {
        if (framesread < uStack_b8) {
          pd_error(x,"soundfiler read: truncated to %ld elements",framesread);
          uStack_b8 = framesread;
        }
        maxsize = uStack_b8;
        for (skipframes._4_4_ = 0; skipframes._4_4_ < iVar3; skipframes._4_4_ = skipframes._4_4_ + 1
            ) {
          garray_resize_long((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],uStack_b8);
          garray_setsaveit((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],0);
          iVar4 = garray_getfloatwords
                            ((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],
                             (int *)((long)&thisread + 4),vecs + (long)skipframes._4_4_ + -1);
          if ((iVar4 == 0) || ((long)thisread._4_4_ != uStack_b8)) {
            pd_error(x,"soundfiler read: resize failed");
            goto LAB_0013bf4d;
          }
        }
      }
      if (maxsize == 0) {
        maxsize = 0xffffffffffffffff;
      }
      if ((-1 < (long)uStack_b8) && (uStack_b8 < maxsize)) {
        maxsize = uStack_b8;
      }
      if (((iVar3 != 0) || (bVar2)) || (maxsize == 0xffffffffffffffff)) {
        uVar8 = (ulong)(int)(0x400 / (long)sf.sf_headersize._4_4_);
        for (bufframes = 0; bufframes < maxsize; bufframes = nframes_00 + bufframes) {
          local_960 = maxsize - bufframes;
          if (uVar8 < local_960) {
            local_960 = uVar8;
          }
          _vecsize_3 = local_960;
          sVar9 = read(resize,&flag,local_960 * (long)sf.sf_headersize._4_4_);
          nframes_00 = sVar9 / (long)sf.sf_headersize._4_4_;
          if ((long)nframes_00 < 1) break;
          soundfile_xferin_words
                    ((t_soundfile *)&resize,iVar3,(t_word **)(sampbuf + 0x3f8),bufframes,
                     (uchar *)&flag,nframes_00);
        }
        if ((raw != 0) && (bufframes < maxsize)) {
          post("warning: soundfile %s header promised %ld points but file was truncated to %ld",
               pcVar5,maxsize,bufframes);
        }
        for (skipframes._4_4_ = 0; skipframes._4_4_ < iVar3; skipframes._4_4_ = skipframes._4_4_ + 1
            ) {
          iVar4 = garray_getfloatwords
                            ((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],(int *)((long)&foo + 4),
                             vecs + (long)skipframes._4_4_ + -1);
          if (iVar4 != 0) {
            for (nframes = bufframes; (ulong)nframes < (ulong)(long)foo._4_4_; nframes = nframes + 1
                ) {
              vecs[(long)skipframes._4_4_ + -1][nframes].w_float = 0.0;
            }
          }
        }
        for (skipframes._4_4_ = sf.sf_type._4_4_; skipframes._4_4_ < iVar3;
            skipframes._4_4_ = skipframes._4_4_ + 1) {
          iVar4 = garray_getfloatwords
                            ((_garray *)vecs[(long)skipframes._4_4_ + 0x3f],(int *)&foo,&local_940);
          if (iVar4 != 0) {
            for (nframes = 0; (ulong)nframes < (ulong)(long)(int)foo; nframes = nframes + 1) {
              local_940[nframes].w_float = 0.0;
            }
          }
        }
        for (skipframes._4_4_ = 0; skipframes._4_4_ < iVar3; skipframes._4_4_ = skipframes._4_4_ + 1
            ) {
          garray_redraw((_garray *)vecs[(long)skipframes._4_4_ + 0x3f]);
        }
      }
      else {
        bufframes = maxsize;
      }
    }
  }
  else {
    _auStack_920 = finalsize;
    a.aa_onsetframe = maxsize;
    a._16_8_ = sampbuf + 0x3f8;
    a.aa_vectors = vecs + 0x3f;
    a.aa_garrays._0_4_ = raw;
    a._40_8_ = framesread;
    a.aa_maxsize._0_4_ = 0;
    a.aa_nframes._0_4_ = iVar3;
    if (iVar3 == 0) {
      pd_error(x,"soundfiler read: \'-ascii\' requires at least one table");
    }
    else {
      iVar4 = soundfiler_readascii(x,pcVar5,(t_asciiargs *)auStack_920);
      bufframes = (size_t)iVar4;
      if (bufframes != 0) {
        tVar11 = sys_getsr();
        sf.sf_type._0_4_ = (int)tVar11;
        sf.sf_bytespersample = 0;
        sf._28_4_ = 0;
        sf.sf_samplerate = 4;
        sf.sf_type._4_4_ = iVar3;
        sf.sf_headersize._0_4_ = sys_isbigendian();
      }
    }
  }
LAB_0013bf4d:
  resize = -1;
  if (-1 < ascii) {
    sys_close(ascii);
  }
  outlet_soundfileinfo(x->x_out2,(t_soundfile *)&resize);
  local_964 = (float)bufframes;
  outlet_float((x->x_obj).te_outlet,local_964);
  return;
}

Assistant:

static void soundfiler_read(t_soundfiler *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_soundfile sf = {0};
    int fd = -1, resize = 0, ascii = 0, raw = 0, i;
    size_t skipframes = 0, finalsize = 0, maxsize = SFMAXFRAMES,
           framesread = 0, bufframes, j;
    ssize_t nframes, framesinfile;
    char endianness;
    const char *filename;
    t_garray *garrays[MAXSFCHANS];
    t_word *vecs[MAXSFCHANS];
    char sampbuf[SAMPBUFSIZE];

    soundfile_clear(&sf);
    sf.sf_headersize = -1;
    while (argc > 0 && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name + 1;
        if (!strcmp(flag, "skip"))
        {
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                (argv[1].a_w.w_float) < 0)
                    goto usage;
            skipframes = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(flag, "ascii"))
        {
            if (sf.sf_headersize >= 0)
                post("'-ascii' overridden by '-raw'");
            ascii = 1;
            argc--; argv++;
        }
        else if (!strcmp(flag, "raw"))
        {
            if (ascii)
                post("'-ascii' overridden by '-raw'");
            else if (sf.sf_type)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            if (argc < 5 ||
                argv[1].a_type != A_FLOAT ||
                ((sf.sf_headersize = argv[1].a_w.w_float) < 0) ||
                argv[2].a_type != A_FLOAT ||
                ((sf.sf_nchannels = argv[2].a_w.w_float) < 1) ||
                (sf.sf_nchannels > MAXSFCHANS) ||
                argv[3].a_type != A_FLOAT ||
                ((sf.sf_bytespersample = argv[3].a_w.w_float) < 2) ||
                    (sf.sf_bytespersample > 4) ||
                argv[4].a_type != A_SYMBOL ||
                    ((endianness = argv[4].a_w.w_symbol->s_name[0]) != 'b'
                    && endianness != 'l' && endianness != 'n'))
                        goto usage;
            if (endianness == 'b')
                sf.sf_bigendian = 1;
            else if (endianness == 'l')
                sf.sf_bigendian = 0;
            else
                sf.sf_bigendian = sys_isbigendian();
            sf.sf_samplerate = sys_getsr();
            sf.sf_bytesperframe = sf.sf_nchannels * sf.sf_bytespersample;
            raw = 1;
            argc -= 5; argv += 5;
        }
        else if (!strcmp(flag, "resize"))
        {
            resize = 1;
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "maxsize"))
        {
            ssize_t tmp;
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                ((tmp = (argv[1].a_w.w_float > SFMAXFRAMES ?
                SFMAXFRAMES : argv[1].a_w.w_float)) < 0))
                    goto usage;
            maxsize = (size_t)tmp;
            resize = 1;     /* maxsize implies resize */
            argc -= 2; argv += 2;
        }
        else
        {
                /* check for type by name */
            if (!(sf.sf_type = soundfile_findtype(flag)))
                goto usage; /* unknown flag */
            ascii = 0; /* replaced */
            if (sf.sf_headersize >= 0)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            argc -= 1; argv += 1;
        }
    }
    if (sf.sf_headersize >= 0)
    {
        ascii = 0;
        sf.sf_type = NULL;
    }
    if (argc < 1 ||                           /* no filename or tables */
        argc > MAXSFCHANS + 1 ||              /* too many tables */
        argv[0].a_type != A_SYMBOL)           /* bad filename */
            goto usage;
    filename = argv[0].a_w.w_symbol->s_name;
    argc--; argv++;

        /* check for implicit ascii */
    if (!ascii && !sf.sf_type && sf.sf_headersize < 0)
        ascii = ascii_hasextension(filename, MAXPDSTRING);

    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (argv[i].a_type != A_SYMBOL)
            goto usage;
        if (!(garrays[i] =
            (t_garray *)pd_findbyclass(argv[i].a_w.w_symbol, garray_class)))
        {
            pd_error(x, "soundfiler read: %s: no such table",
                argv[i].a_w.w_symbol->s_name);
            goto done;
        }
        else if (!garray_getfloatwords(garrays[i], &vecsize,
                &vecs[i]))
            pd_error(x, "soundfiler read: %s: bad template for tabwrite",
                argv[i].a_w.w_symbol->s_name);
        if (finalsize && finalsize != (size_t)vecsize && !resize)
        {
            post("arrays have different lengths, resizing...");
            resize = 1;
        }
        finalsize = vecsize;
    }
    if (ascii)
    {
        t_asciiargs a =
            {skipframes, finalsize, argc, vecs, garrays, resize, maxsize, 0};
        if (!argc)
        {
            pd_error(x, "soundfiler read: "
                        "'-ascii' requires at least one table");
            goto done;
        }
        if ((framesread = soundfiler_readascii(x, filename, &a)) == 0)
            goto done;
            /* fill in for info outlet */
        sf.sf_samplerate = sys_getsr();
        sf.sf_headersize = 0;
        sf.sf_nchannels = argc;
        sf.sf_bytespersample = 4;
        sf.sf_bigendian = sys_isbigendian();
        goto done;
    }

    fd = open_soundfile_via_canvas(x->x_canvas, filename, &sf, skipframes);
    if (fd < 0)
    {
        object_sferror(x, "soundfiler read", filename, errno, &sf);
        goto done;
    }
    framesinfile = sf.sf_bytelimit / sf.sf_bytesperframe;

    if (resize)
    {
            /* figure out what to resize to using header info */
        if ((size_t)framesinfile > maxsize)
        {
            pd_error(x, "soundfiler read: truncated to %ld elements",
                (long)maxsize);
            framesinfile = maxsize;
        }
        finalsize = framesinfile;
        for (i = 0; i < argc; i++)
        {
            int vecsize;
            garray_resize_long(garrays[i], finalsize);
                /* for sanity's sake let's clear the save-in-patch flag here */
            garray_setsaveit(garrays[i], 0);
            if (!garray_getfloatwords(garrays[i], &vecsize, &vecs[i])
                /* if the resize failed, garray_resize reported the error */
                || (vecsize != framesinfile))
            {
                pd_error(x, "soundfiler read: resize failed");
                goto done;
            }
        }
    }

    if (!finalsize) finalsize = SFMAXFRAMES;
    if (framesinfile >= 0 && finalsize > (size_t)framesinfile)
        finalsize = framesinfile;

        /* no tablenames, try to use header info instead of reading */
    if (argc == 0 &&
        !(raw ||                     /* read if raw */
          finalsize == SFMAXFRAMES)) /* read if unknown size */
    {
        framesread = finalsize;
#ifdef DEBUG_SOUNDFILE
    post("skipped reading frames");
#endif
        goto done;
    }

        /* read */
#ifdef DEBUG_SOUNDFILE
    post("reading frames");
#endif
    bufframes = SAMPBUFSIZE / sf.sf_bytesperframe;
    for (framesread = 0; framesread < finalsize;)
    {
        size_t thisread = finalsize - framesread;
        thisread = (thisread > bufframes ? bufframes : thisread);
        nframes = read(sf.sf_fd, sampbuf,
            thisread * sf.sf_bytesperframe) / sf.sf_bytesperframe;
        if (nframes <= 0) break;
        soundfile_xferin_words(&sf, argc, vecs, framesread,
            (unsigned char *)sampbuf, nframes);
        framesread += nframes;
    }
        /* warn if a file's bad size field is gobbling memory */
    if (resize && framesread < (size_t)finalsize)
    {
        post("warning: soundfile %s header promised \
%ld points but file was truncated to %ld",
            filename, (long)finalsize, (long)framesread);
    }
        /* zero out remaining elements of vectors */
    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (garray_getfloatwords(garrays[i], &vecsize, &vecs[i]))
            for (j = framesread; j < (size_t)vecsize; j++)
                vecs[i][j].w_float = 0;
    }
        /* zero out vectors in excess of number of channels */
    for (i = sf.sf_nchannels; i < argc; i++)
    {
        int vecsize;
        t_word *foo;
        if (garray_getfloatwords(garrays[i], &vecsize, &foo))
            for (j = 0; j < (size_t)vecsize; j++)
                foo[j].w_float = 0;
    }
        /* do all graphics updates */
    for (i = 0; i < argc; i++)
        garray_redraw(garrays[i]);
    goto done;
usage:
    pd_error(x, "usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...", sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> "
         "<endian (b, l, or n)>");
done:
    sf.sf_fd = -1;
    if (fd >= 0)
        sys_close(fd);
    outlet_soundfileinfo(x->x_out2, &sf);
    outlet_float(x->x_obj.ob_outlet, (t_float)framesread);
}